

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O2

double variance(int *I_l,int n_int)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  iVar1 = sum(I_l,n_int);
  uVar2 = 0;
  uVar3 = 0;
  if (0 < n_int) {
    uVar3 = (ulong)(uint)n_int;
  }
  dVar4 = 0.0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    dVar5 = (double)I_l[uVar2 + 1] - (double)iVar1 / (double)n_int;
    dVar4 = dVar4 + dVar5 * dVar5;
  }
  return dVar4 / (double)(n_int + -1);
}

Assistant:

double variance(int* I_l, int n_int)
{
    double l_mean = double(sum(I_l,n_int)) / n_int;
    double l_var = 0;

    for(int i=1; i<=n_int; i++)
    {
        l_var += pow(I_l[i]-l_mean, 2);
    }

    l_var /= n_int-1;
    return l_var;
}